

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Section::~Section(Section *this)

{
  bool bVar1;
  IResultCapture *pIVar2;
  undefined1 local_80 [8];
  SectionEndInfo endInfo;
  Section *this_local;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_0040e538;
  endInfo.durationInSeconds = (double)this;
  if ((this->m_sectionIncluded & 1U) != 0) {
    SectionInfo::SectionInfo((SectionInfo *)local_80,&this->m_info);
    endInfo.prevAssertions.failed = (this->m_assertions).failedButOk;
    endInfo.sectionInfo.lineInfo.line = (this->m_assertions).passed;
    endInfo.prevAssertions.passed = (this->m_assertions).failed;
    endInfo.prevAssertions.failedButOk = (size_t)Timer::getElapsedSeconds(&this->m_timer);
    bVar1 = uncaught_exceptions();
    if (bVar1) {
      pIVar2 = getResultCapture();
      (*pIVar2->_vptr_IResultCapture[4])(pIVar2,local_80);
    }
    else {
      pIVar2 = getResultCapture();
      (*pIVar2->_vptr_IResultCapture[3])(pIVar2,local_80);
    }
    SectionEndInfo::~SectionEndInfo((SectionEndInfo *)local_80);
  }
  std::__cxx11::string::~string((string *)&this->m_name);
  SectionInfo::~SectionInfo(&this->m_info);
  NonCopyable::~NonCopyable(&this->super_NonCopyable);
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded ) {
            SectionEndInfo endInfo{ m_info, m_assertions, m_timer.getElapsedSeconds() };
            if( uncaught_exceptions() )
                getResultCapture().sectionEndedEarly( endInfo );
            else
                getResultCapture().sectionEnded( endInfo );
        }
    }